

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.h
# Opt level: O0

void load_GL_ARB_texture_compression(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_ARB_texture_compression != 0) {
    glad_glCompressedTexImage3DARB =
         (PFNGLCOMPRESSEDTEXIMAGE3DARBPROC)(*load)("glCompressedTexImage3DARB");
    glad_glCompressedTexImage2DARB =
         (PFNGLCOMPRESSEDTEXIMAGE2DARBPROC)(*load)("glCompressedTexImage2DARB");
    glad_glCompressedTexImage1DARB =
         (PFNGLCOMPRESSEDTEXIMAGE1DARBPROC)(*load)("glCompressedTexImage1DARB");
    glad_glCompressedTexSubImage3DARB =
         (PFNGLCOMPRESSEDTEXSUBIMAGE3DARBPROC)(*load)("glCompressedTexSubImage3DARB");
    glad_glCompressedTexSubImage2DARB =
         (PFNGLCOMPRESSEDTEXSUBIMAGE2DARBPROC)(*load)("glCompressedTexSubImage2DARB");
    glad_glCompressedTexSubImage1DARB =
         (PFNGLCOMPRESSEDTEXSUBIMAGE1DARBPROC)(*load)("glCompressedTexSubImage1DARB");
    glad_glGetCompressedTexImageARB =
         (PFNGLGETCOMPRESSEDTEXIMAGEARBPROC)(*load)("glGetCompressedTexImageARB");
  }
  return;
}

Assistant:

static void load_GL_ARB_texture_compression(GLADloadproc load) {
	if(!GLAD_GL_ARB_texture_compression) return;
	glad_glCompressedTexImage3DARB = (PFNGLCOMPRESSEDTEXIMAGE3DARBPROC)load("glCompressedTexImage3DARB");
	glad_glCompressedTexImage2DARB = (PFNGLCOMPRESSEDTEXIMAGE2DARBPROC)load("glCompressedTexImage2DARB");
	glad_glCompressedTexImage1DARB = (PFNGLCOMPRESSEDTEXIMAGE1DARBPROC)load("glCompressedTexImage1DARB");
	glad_glCompressedTexSubImage3DARB = (PFNGLCOMPRESSEDTEXSUBIMAGE3DARBPROC)load("glCompressedTexSubImage3DARB");
	glad_glCompressedTexSubImage2DARB = (PFNGLCOMPRESSEDTEXSUBIMAGE2DARBPROC)load("glCompressedTexSubImage2DARB");
	glad_glCompressedTexSubImage1DARB = (PFNGLCOMPRESSEDTEXSUBIMAGE1DARBPROC)load("glCompressedTexSubImage1DARB");
	glad_glGetCompressedTexImageARB = (PFNGLGETCOMPRESSEDTEXIMAGEARBPROC)load("glGetCompressedTexImageARB");
}